

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O2

Sequence * __thiscall
Sequence::operator*(Sequence *__return_storage_ptr__,Sequence *this,Sequence *t_seq)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  size_type sVar4;
  uint *puVar5;
  int i;
  long __n;
  
  sVar3 = std::deque<int,_std::allocator<int>_>::size(&this->m_bits);
  Sequence(__return_storage_ptr__,(int)sVar3);
  sVar3 = std::deque<int,_std::allocator<int>_>::size(&this->m_bits);
  sVar4 = std::deque<int,_std::allocator<int>_>::size(&t_seq->m_bits);
  if ((int)sVar3 == (int)sVar4) {
    __n = 0;
    while( true ) {
      sVar3 = std::deque<int,_std::allocator<int>_>::size(&t_seq->m_bits);
      if ((int)sVar3 <= __n) break;
      puVar5 = (uint *)std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                 (&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start,__n);
      uVar1 = *puVar5;
      puVar5 = (uint *)operator[](t_seq,(int)__n);
      uVar2 = *puVar5;
      puVar5 = (uint *)operator[](__return_storage_ptr__,(int)__n);
      *puVar5 = uVar2 ^ uVar1;
      __n = __n + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::operator*(Sequence t_seq) {
    Sequence res(size());
    if (size() != t_seq.size()) {
        return res;
    }
    for (auto i = 0; i < t_seq.size(); ++i) {
        res[i] = m_bits[i] ^ t_seq[i];
    }
    return res;
}